

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int param_1,char **param_2)

{
  int iVar1;
  int iVar2;
  undefined8 uVar3;
  byte bVar4;
  int iVar5;
  size_type sVar6;
  reference pvVar7;
  ostream *poVar8;
  Scalar_<double> *pSVar9;
  float Focal_Length;
  float __val;
  size_t *psVar10;
  _InputArray local_5b8;
  allocator<char> local_599;
  string local_598 [32];
  _InputArray local_578;
  allocator<char> local_559;
  string local_558 [32];
  Scalar_<double> local_538;
  Point_<int> local_518;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_510;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4f0;
  _InputOutputArray local_4d0;
  undefined1 local_4b8 [8];
  string s_distance;
  Rect_<int> local_478;
  _InputOutputArray local_468;
  undefined1 local_450 [8];
  Rect rec;
  size_t i;
  Size_<int> local_430;
  _InputArray local_428;
  undefined1 local_410 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> faces;
  _InputArray local_3e0;
  undefined4 local_3c4;
  undefined1 local_3c0 [4];
  int flags;
  undefined4 local_3a8;
  undefined4 local_3a4;
  int apiID;
  int deviceID;
  VideoCapture cap;
  _InputArray local_370;
  allocator<char> local_351;
  string local_350 [32];
  Scalar_<double> local_330;
  Rect_<int> local_310;
  _InputOutputArray local_300;
  undefined1 local_2e8 [8];
  Rect bbox;
  size_t j;
  Size_<int> local_2c8;
  _InputArray local_2c0;
  undefined1 local_2a8 [8];
  vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> R_face;
  string local_288 [32];
  string local_268 [96];
  Mat local_208 [8];
  Mat Reference_image;
  int local_1a8;
  allocator<char> local_191;
  string local_190 [8];
  string Xml_path;
  Mat G_Blur;
  Mat local_110 [8];
  Mat Gray;
  Mat local_b0 [8];
  Mat frame;
  int NNB;
  double scale_factor;
  CascadeClassifier FaceDectector;
  float local_2c;
  float distance;
  float face_width_in_image;
  float Real_face_width;
  float orginal_distnace;
  float focal_length;
  int face_width;
  char **param_1_local;
  int param_0_local;
  
  cv::CascadeClassifier::CascadeClassifier((CascadeClassifier *)&scale_factor);
  cv::Mat::Mat(local_b0);
  cv::Mat::Mat(local_110);
  cv::Mat::Mat((Mat *)(Xml_path.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_190,
             "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml"
             ,&local_191);
  std::allocator<char>::~allocator(&local_191);
  bVar4 = cv::CascadeClassifier::load((string *)&scale_factor);
  if ((bVar4 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"erro loading file xml face detector");
    param_1_local._4_4_ = -1;
  }
  else {
    std::operator<<((ostream *)&std::cout,"HarrCascade xml  file is Loaded");
    cv::Mat::Mat(local_208);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (local_288,
               "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png"
               ,(allocator<char> *)
                ((long)&R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cv::imread(local_268,(int)local_288);
    cv::Mat::operator=(local_208,(Mat *)local_268);
    cv::Mat::~Mat((Mat *)local_268);
    std::__cxx11::string::~string(local_288);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&R_face.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8);
    cv::_InputArray::_InputArray(&local_2c0,local_208);
    cv::Size_<int>::Size_(&local_2c8);
    cv::Size_<int>::Size_((Size_<int> *)&j);
    pSVar9 = (Scalar_<double> *)0x0;
    cv::CascadeClassifier::detectMultiScale
              (0x3ff4cccccccccccd,&scale_factor,&local_2c0,local_2a8,3,0,&local_2c8,&j);
    cv::_InputArray::~_InputArray(&local_2c0);
    std::operator<<((ostream *)&std::cout,"before---------------------");
    bbox.width = 0;
    bbox.height = 0;
    for (; uVar3 = bbox._8_8_,
        sVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                          ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8),
        (ulong)uVar3 < sVar6; bbox._8_8_ = bbox._8_8_ + 1) {
      std::operator<<((ostream *)&std::cout,"reading===========");
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      std::ostream::operator<<((ostream *)&std::cout,pvVar7->x);
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      iVar5 = pvVar7->x;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      iVar1 = pvVar7->y;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      iVar2 = pvVar7->width;
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      cv::Rect_<int>::Rect_((Rect_<int> *)local_2e8,iVar5,iVar1,iVar2,pvVar7->height);
      cv::_InputOutputArray::_InputOutputArray(&local_300,local_208);
      cv::Rect_<int>::Rect_(&local_310,(Rect_<int> *)local_2e8);
      cv::Scalar_<double>::Scalar_(&local_330,0.0,255.0,255.0,0.0);
      pSVar9 = (Scalar_<double> *)0x8;
      cv::rectangle(&local_300,&local_310,&local_330,2,8,0);
      cv::_InputOutputArray::~_InputOutputArray(&local_300);
      pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                         ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8,
                          bbox._8_8_);
      local_2c = (float)pvVar7->width;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_350,"reference",&local_351);
    cv::_InputArray::_InputArray(&local_370,local_208);
    cv::imshow(local_350,&local_370);
    cv::_InputArray::~_InputArray(&local_370);
    std::__cxx11::string::~string(local_350);
    std::allocator<char>::~allocator(&local_351);
    Focal_Length = FocalLengthFinder(30.1,14.3,local_2c);
    cv::VideoCapture::VideoCapture((VideoCapture *)&apiID);
    local_3a4 = 2;
    local_3a8 = 0;
    cv::VideoCapture::open((int)&apiID,2);
    bVar4 = cv::VideoCapture::isOpened();
    if ((bVar4 & 1) == 0) {
      std::operator<<((ostream *)&std::cerr,"ERROR! Unable to open camera\n");
      param_1_local._4_4_ = -1;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cout,"Start grabbing");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      poVar8 = std::operator<<(poVar8,"Press any key to terminate");
      std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      do {
        iVar5 = (int)pSVar9;
        cv::_OutputArray::_OutputArray((_OutputArray *)local_3c0,local_b0);
        cv::VideoCapture::read((_OutputArray *)&apiID);
        cv::_OutputArray::~_OutputArray((_OutputArray *)local_3c0);
        bVar4 = cv::Mat::empty();
        if ((bVar4 & 1) != 0) {
          std::operator<<((ostream *)&std::cerr,"ERROR! blank frame grabbed\n");
          break;
        }
        local_3c4 = 3;
        cv::_InputArray::_InputArray(&local_3e0,local_b0);
        cv::_OutputArray::_OutputArray
                  ((_OutputArray *)
                   &faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,local_110);
        cv::cvtColor((cv *)&local_3e0,
                     (_InputArray *)
                     &faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(_OutputArray *)0x6,0,iVar5)
        ;
        cv::_OutputArray::~_OutputArray
                  ((_OutputArray *)
                   &faces.super__Vector_base<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        cv::_InputArray::~_InputArray(&local_3e0);
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::vector
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410);
        cv::_InputArray::_InputArray(&local_428,local_110);
        cv::Size_<int>::Size_(&local_430);
        cv::Size_<int>::Size_((Size_<int> *)&i);
        psVar10 = &i;
        pSVar9 = (Scalar_<double> *)0x0;
        cv::CascadeClassifier::detectMultiScale
                  (0x3ff4cccccccccccd,&scale_factor,&local_428,local_410,3,0,&local_430,psVar10);
        cv::_InputArray::~_InputArray(&local_428);
        rec.width = 0;
        rec.height = 0;
        for (; uVar3 = rec._8_8_,
            sVar6 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::size
                              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410
                              ), (ulong)uVar3 < sVar6; rec._8_8_ = rec._8_8_ + 1) {
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          cord_x = pvVar7->x;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          cord_y = pvVar7->y;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          cord_w = pvVar7->width;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          cord_height = pvVar7->height;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          iVar5 = pvVar7->x;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          iVar1 = pvVar7->y;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          iVar2 = pvVar7->width;
          pvVar7 = std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::operator[]
                             ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410,
                              rec._8_8_);
          cv::Rect_<int>::Rect_((Rect_<int> *)local_450,iVar5,iVar1,iVar2,pvVar7->height);
          cv::_InputOutputArray::_InputOutputArray(&local_468,local_b0);
          cv::Rect_<int>::Rect_(&local_478,(Rect_<int> *)local_450);
          cv::Scalar_<double>::Scalar_
                    ((Scalar_<double> *)((long)&s_distance.field_2 + 8),0.0,255.0,255.0,0.0);
          cv::rectangle(&local_468,&local_478,(undefined1 *)((long)&s_distance.field_2 + 8),2,8,0);
          cv::_InputOutputArray::~_InputOutputArray(&local_468);
          __val = Distance_Finder(14.3,Focal_Length,(float)cord_w);
          std::__cxx11::to_string((string *)local_4b8,__val);
          cv::_InputOutputArray::_InputOutputArray(&local_4d0,local_b0);
          std::operator+(&local_510,"Distance= ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_4b8);
          std::operator+(&local_4f0,&local_510," Inches");
          cv::Point_<int>::Point_(&local_518,0x32,0x32);
          cv::Scalar_<double>::Scalar_(&local_538,255.0,0.0,255.0,0.0);
          psVar10 = (size_t *)((ulong)psVar10 & 0xffffffff00000000);
          pSVar9 = &local_538;
          cv::putText(0x3fe6666666666666,&local_4d0,&local_4f0,&local_518,2,pSVar9,2,psVar10,0);
          std::__cxx11::string::~string((string *)&local_4f0);
          std::__cxx11::string::~string((string *)&local_510);
          cv::_InputOutputArray::~_InputOutputArray(&local_4d0);
          std::__cxx11::string::~string((string *)local_4b8);
        }
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_558,"Gray",&local_559);
        cv::_InputArray::_InputArray(&local_578,local_110);
        cv::imshow(local_558,&local_578);
        cv::_InputArray::~_InputArray(&local_578);
        std::__cxx11::string::~string(local_558);
        std::allocator<char>::~allocator(&local_559);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(local_598,"Live",&local_599);
        cv::_InputArray::_InputArray(&local_5b8,local_b0);
        cv::imshow(local_598,&local_5b8);
        cv::_InputArray::~_InputArray(&local_5b8);
        std::__cxx11::string::~string(local_598);
        std::allocator<char>::~allocator(&local_599);
        iVar5 = cv::waitKey(1);
        if (iVar5 < 0) {
          local_1a8 = 0;
        }
        else {
          local_1a8 = 5;
        }
        std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
                  ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_410);
      } while (local_1a8 == 0);
      param_1_local._4_4_ = 0;
    }
    cv::VideoCapture::~VideoCapture((VideoCapture *)&apiID);
    std::vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_>::~vector
              ((vector<cv::Rect_<int>,_std::allocator<cv::Rect_<int>_>_> *)local_2a8);
    cv::Mat::~Mat(local_208);
  }
  std::__cxx11::string::~string(local_190);
  cv::Mat::~Mat((Mat *)(Xml_path.field_2._M_local_buf + 8));
  cv::Mat::~Mat(local_110);
  cv::Mat::~Mat(local_b0);
  cv::CascadeClassifier::~CascadeClassifier((CascadeClassifier *)&scale_factor);
  return param_1_local._4_4_;
}

Assistant:

int main(int, char**)

{
    //defining face detector uisng haarcasecde opencv
    //distance calculation data
    int face_width;// it will be width of 

    float focal_length;
    float orginal_distnace = 30.1;// Inches
    float Real_face_width = 14.3; //inches
    float face_width_in_image ;
    float distance;
    // int Distnace_R ;

    //===========
    //face detector object
    CascadeClassifier FaceDectector;
   // Variables 
    double scale_factor;
    int NNB;
   // Mat objects for images 
    Mat frame;
    Mat Gray;
    Mat G_Blur;

    //define the path of xml file
    string Xml_path = "C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/haarcascade_frontalface_default.xml";
    if (!FaceDectector.load(Xml_path))
    {
        cout << "erro loading file xml face detector";
        return -1;

    }
    else {
        cout << "HarrCascade xml  file is Loaded";
    }
    Mat Reference_image;
    //reading the reference image from directory
    Reference_image = imread("C:/Users/Asadullah/Documents/Projects/CplusPlusDistanceEstimation/reference_image.png", IMREAD_GRAYSCALE);
    //std::vector<Rect> faces;
    std::vector<Rect> R_face;

    FaceDectector.detectMultiScale(Reference_image, R_face, 1.3);
 
    cout << "before---------------------";
    for (size_t j = 0; j < R_face.size(); j++) {
        cout << "reading===========";
        cout << R_face[j].x;
        Rect bbox = Rect(R_face[j].x, R_face[j].y, R_face[j].width, R_face[j].height);
        rectangle(Reference_image,bbox, Scalar(0, 255, 255), 2, 8, 0);
        face_width_in_image = R_face[j].width;
        

    }
    imshow("reference", Reference_image);
 
    focal_length = FocalLengthFinder(orginal_distnace, Real_face_width, face_width_in_image);

       //--- INITIALIZE VIDEOCAPTURE
    VideoCapture cap;
    // open the default camera using default API
    // cap.open(0);
    // OR advance usage: select any API backend
    int deviceID = 2;             // 0 = open default camera
    int apiID = cv::CAP_ANY;      // 0 = autodetect default API
    // open selected camera using selected API
    cap.open(deviceID, apiID);
    // check if we succeeded
    if (!cap.isOpened()) {
        cerr << "ERROR! Unable to open camera\n";
        return -1;
    }
    //--- GRAB AND WRITE LOOP
    cout << "Start grabbing" << endl
        << "Press any key to terminate" << endl;
    for (;;)
    {
        // wait for a new frame from camera and store it into 'frame'
        cap.read(frame);
        // check if we succeeded
        if (frame.empty()) {
            cerr << "ERROR! blank frame grabbed\n";
            break;
        }
        scale_factor = 1.3;
        NNB = 10;
        int flags = 3;
        // converting the color to gray 
        cvtColor(frame, Gray, COLOR_BGR2GRAY);
        
        // equalizeHist(Gray, Gray);
        // storing the face points in the vector
        vector<Rect> faces;
        FaceDectector.detectMultiScale(Gray, faces,scale_factor);
        for (size_t i = 0; i < faces.size(); i++) {
            //Point center(faces[i].x + faces[i].width / 2, faces[i].y + faces[i].height / 2);
            //ellipse(frame, center, Size(faces[i].width / 2, faces[i].height / 2), 0, 0, 360, Scalar(255, 0, 255), 4);
          //  Mat faceReginOf_intereset = Gray(faces[i]);
            cord_x = faces[i].x; cord_y = faces[i].y; cord_w = faces[i].width; cord_height = faces[i].height;
            //cout << cord_x, cord_y, cord_w, cord_height;
            Rect rec = Rect(faces[i].x, faces[i].y, faces[i].width,faces[i].height);
		    rectangle(frame, rec, Scalar(0, 255, 255), 2, 8, 0);
            distance = Distance_Finder(Real_face_width, focal_length, cord_w);
            // cout << "  ";
            // cout << distance, "  ";
            // Distnace_R = round(distance);
            // cout<<"Distnace = ", Distnace_R<<endl; 
            string s_distance= to_string(distance);
            

            // drwaing the  text on the Screen
            cv::putText(frame, "Distance= "+s_distance+" Inches", cv::Point(50, 50), cv::FONT_HERSHEY_DUPLEX, 0.7, cv::Scalar(255, 0, 255), 2, false);
            // cout << "   ";
            //cout << focal_length;
        
        }

        //GaussianBlur(Gray, G_Blur, Size(3, 3), 0);
        // show live and wait for a key with timeout long enough to show images
        imshow("Gray", Gray);
        imshow("Live", frame);
        if (waitKey(1) >= 0)
            break;
    }
    // the camera will be deinitialized automatically in VideoCapture destructor
    return 0;
}